

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int luaG_traceexec(lua_State *L,Instruction *pc)

{
  int *piVar1;
  byte *pbVar2;
  CallInfo *pCVar3;
  Proto *f;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int pc_00;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  
  pCVar3 = L->ci;
  uVar8 = L->hookmask;
  if ((uVar8 & 0xc) == 0) {
    (pCVar3->u).l.trap = 0;
    return 0;
  }
  f = *(Proto **)((((pCVar3->func).p)->val).value_.f + 0x18);
  (pCVar3->u).l.savedpc = pc + 1;
  if ((uVar8 & 8) == 0) {
    bVar14 = false;
  }
  else {
    piVar1 = &L->hookcount;
    *piVar1 = *piVar1 + -1;
    bVar14 = *piVar1 == 0;
  }
  if (bVar14) {
    L->hookcount = L->basehookcount;
  }
  else if ((uVar8 & 4) == 0) {
    return 1;
  }
  if ((pCVar3->callstatus >> 0x17 & 1) != 0) {
    pCVar3->callstatus = pCVar3->callstatus & 0xff7fffff;
    return 1;
  }
  iVar6 = luaP_isIT(*(Instruction *)((pCVar3->u).c.k + -4));
  if (iVar6 == 0) {
    L->top = pCVar3->top;
  }
  if (bVar14) {
    luaD_hook(L,3,-1,0,0);
  }
  if ((uVar8 & 4) == 0) goto LAB_0010ad14;
  uVar8 = 0;
  iVar6 = L->oldpc;
  if (f->sizecode <= L->oldpc) {
    iVar6 = 0;
  }
  iVar7 = (int)((ulong)((long)(pc + 1) - (long)f->code) >> 2);
  pc_00 = iVar7 + -1;
  if (iVar6 < pc_00) {
    if (f->lineinfo != (ls_byte *)0x0) {
      if (pc_00 - iVar6 < 0x40) {
        uVar9 = (ulong)iVar6;
        lVar5 = uVar9 + 1;
        lVar10 = 0;
        iVar11 = 0;
        do {
          iVar13 = (int)f->lineinfo[lVar10 + lVar5];
          iVar12 = 0;
          if (iVar13 == -0x80) {
            iVar12 = 2;
LAB_0010acb9:
            bVar4 = false;
          }
          else {
            iVar11 = iVar11 + iVar13;
            bVar4 = true;
            if ((iVar7 - iVar6) + -2 == (int)lVar10) {
              uVar9 = (ulong)(iVar11 != 0);
              iVar12 = 1;
              goto LAB_0010acb9;
            }
          }
          uVar8 = (uint)uVar9;
          lVar10 = lVar10 + 1;
        } while (iVar12 == 0);
        if ((iVar12 != 2) && (!bVar4)) goto LAB_0010acec;
      }
      iVar6 = luaG_getfuncline(f,iVar6);
      iVar7 = luaG_getfuncline(f,pc_00);
      uVar8 = (uint)(iVar6 != iVar7);
    }
LAB_0010acec:
    if (uVar8 != 0) goto LAB_0010acf0;
  }
  else {
LAB_0010acf0:
    iVar6 = luaG_getfuncline(f,pc_00);
    luaD_hook(L,2,iVar6,0,0);
  }
  L->oldpc = pc_00;
LAB_0010ad14:
  if (L->status != '\x01') {
    return 1;
  }
  if (bVar14) {
    L->hookcount = 1;
  }
  pbVar2 = (byte *)((long)&pCVar3->callstatus + 2);
  *pbVar2 = *pbVar2 | 0x80;
  luaD_throw(L,'\x01');
}

Assistant:

int luaG_traceexec (lua_State *L, const Instruction *pc) {
  CallInfo *ci = L->ci;
  lu_byte mask = cast_byte(L->hookmask);
  const Proto *p = ci_func(ci)->p;
  int counthook;
  if (!(mask & (LUA_MASKLINE | LUA_MASKCOUNT))) {  /* no hooks? */
    ci->u.l.trap = 0;  /* don't need to stop again */
    return 0;  /* turn off 'trap' */
  }
  pc++;  /* reference is always next instruction */
  ci->u.l.savedpc = pc;  /* save 'pc' */
  counthook = (mask & LUA_MASKCOUNT) && (--L->hookcount == 0);
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return 1;  /* no line hook and count != 0; nothing to be done now */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* hook yielded last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return 1;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (!luaP_isIT(*(ci->u.l.savedpc - 1)))  /* top not being used? */
    L->top.p = ci->top.p;  /* correct top */
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1, 0, 0);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    /* 'L->oldpc' may be invalid; use zero in this case */
    int oldpc = (L->oldpc < p->sizecode) ? L->oldpc : 0;
    int npci = pcRel(pc, p);
    if (npci <= oldpc ||  /* call hook when jump back (loop), */
        changedline(p, oldpc, npci)) {  /* or when enter new line */
      int newline = luaG_getfuncline(p, npci);
      luaD_hook(L, LUA_HOOKLINE, newline, 0, 0);  /* call line hook */
    }
    L->oldpc = npci;  /* 'pc' of last call to line hook */
  }
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    luaD_throw(L, LUA_YIELD);
  }
  return 1;  /* keep 'trap' on */
}